

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  long lVar1;
  
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_0015e2a8;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_0015e330;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_0015e378;
  if (0 < this->nNoises) {
    lVar1 = 0;
    do {
      if (this->aNoises[lVar1] != (Noise *)0x0) {
        (*(this->aNoises[lVar1]->super_StochasticVariable).super_StochasticProcess.super_Parametric.
          _vptr_Parametric[1])();
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->nNoises);
  }
  if (this->aNoises != (Noise **)0x0) {
    operator_delete__(this->aNoises);
  }
  if (0 < this->nNoises) {
    lVar1 = 0;
    do {
      if (this->aA[lVar1] != (double *)0x0) {
        operator_delete__(this->aA[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->nNoises);
  }
  if (this->aA != (double **)0x0) {
    operator_delete__(this->aA);
  }
  if (this->aOmega != (double *)0x0) {
    operator_delete__(this->aOmega);
  }
  RandN::~RandN((RandN *)this);
  StochasticProcess::~StochasticProcess(&this->super_StochasticProcess);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}